

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::PhysicalStorageBufferPointerHandler::handle
          (PhysicalStorageBufferPointerHandler *this,Op op,uint32_t *args,uint32_t param_3)

{
  SPIRType *pSVar1;
  SPIRType *type;
  uint32_t param_3_local;
  uint32_t *args_local;
  Op op_local;
  PhysicalStorageBufferPointerHandler *this_local;
  
  if ((((op == OpConvertUToPtr) || (op == OpBitcast)) &&
      (pSVar1 = get<spirv_cross::SPIRType>(this->compiler,*args),
      pSVar1->storage == StorageClassPhysicalStorageBuffer)) &&
     ((((pSVar1->pointer & 1U) != 0 && (pSVar1->pointer_depth == 1)) &&
      (*(int *)&(pSVar1->super_IVariant).field_0xc != 0xf)))) {
    ::std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert(&this->types,args);
  }
  return true;
}

Assistant:

bool Compiler::PhysicalStorageBufferPointerHandler::handle(Op op, const uint32_t *args, uint32_t)
{
	if (op == OpConvertUToPtr || op == OpBitcast)
	{
		auto &type = compiler.get<SPIRType>(args[0]);
		if (type.storage == StorageClassPhysicalStorageBufferEXT && type.pointer && type.pointer_depth == 1)
		{
			// If we need to cast to a pointer type which is not a block, we might need to synthesize ourselves
			// a block type which wraps this POD type.
			if (type.basetype != SPIRType::Struct)
				types.insert(args[0]);
		}
	}

	return true;
}